

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O2

void __thiscall cplus::lang::ByteArray::freeMemory(ByteArray *this)

{
  char *pcVar1;
  size_t index;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = this->size;
  if (uVar4 != this->bufferSize) {
    pcVar2 = (char *)operator_new__(uVar4);
    pcVar1 = this->buffer;
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      pcVar2[uVar3] = pcVar1[uVar3];
    }
    if (pcVar1 != (char *)0x0) {
      operator_delete__(pcVar1);
      uVar4 = this->size;
    }
    this->buffer = pcVar2;
    this->bufferSize = uVar4;
  }
  return;
}

Assistant:

void ByteArray::freeMemory() {
			if (size != bufferSize) {
				auto newBuffer = new char[size];
				for (size_t index = 0; index < size; index++) {
					newBuffer[index] = buffer[index];
				}
				delete[] buffer;
				buffer = newBuffer;
				bufferSize = size;
			}
		}